

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

znzFile nifti_image_write_hdr_img2
                  (nifti_image *nim,int write_opts,char *opts,znzFile imgfile,nifti_brick_list *NBL)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  char **ppcVar4;
  int iVar5;
  znzFile pzVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  uint write_data;
  uint uVar10;
  size_t sVar11;
  znzFile fp;
  char func [27];
  znzFile local_1d0;
  char **local_1c8;
  znzFile local_1c0;
  nifti_brick_list *local_1b8;
  char *local_1b0;
  char local_1a8 [28];
  nifti_1_header local_18c;
  
  local_1d0 = (znzFile)0x0;
  builtin_strncpy(local_1a8 + 0x10,"e_hdr_img2",0xb);
  builtin_strncpy(local_1a8,"nifti_image_writ",0x10);
  local_1c0 = imgfile;
  if (nim == (nifti_image *)0x0) {
    pcVar7 = "NULL input";
  }
  else {
    local_1b8 = NBL;
    iVar5 = nifti_validfilename(nim->fname);
    if (iVar5 == 0) {
      pcVar7 = "bad fname input";
    }
    else {
      write_data = write_opts & 1;
      if ((write_data == 0) || (nim->data != (void *)0x0 || local_1b8 != (nifti_brick_list *)0x0)) {
        local_1b0 = opts;
        if (local_1b8 != (nifti_brick_list *)0x0 && write_data != 0) {
          uVar1 = nim->ndim;
          bVar3 = false;
          if ((int)uVar1 < 1) {
            sVar11 = 0;
            uVar10 = 0;
          }
          else {
            sVar11 = (size_t)nim->nbyper;
            uVar8 = 2;
            if ((ulong)(uVar1 - 1) < 2) {
              uVar8 = (ulong)(uVar1 - 1);
            }
            lVar9 = 0;
            do {
              sVar11 = sVar11 * (long)nim->dim[lVar9 + 1];
              lVar9 = lVar9 + 1;
            } while (uVar8 + 1 != lVar9);
            uVar10 = 1;
            if (3 < (int)uVar1) {
              lVar9 = 0;
              do {
                uVar10 = uVar10 * nim->dim[lVar9 + 4];
                lVar9 = lVar9 + 1;
              } while ((ulong)uVar1 - 3 != lVar9);
            }
          }
          if ((sVar11 != local_1b8->bsize) && (bVar3 = true, 1 < g_opts_0)) {
            fprintf(_stderr,"** NBL/nim mismatch, volbytes = %u, %u\n");
          }
          if ((uVar10 != local_1b8->nbricks) && (bVar3 = true, 1 < g_opts_0)) {
            fprintf(_stderr,"** NBL/nim mismatch, nvols = %d, %d\n");
          }
          if ((!bVar3) && (2 < g_opts_0)) {
            fprintf(_stderr,"-- nim/NBL agree: nvols = %d, nbytes = %u\n",(ulong)uVar10);
          }
          if (bVar3) {
            pcVar7 = "NBL does not match nim";
            goto LAB_0011167e;
          }
        }
        nifti_set_iname_offset(nim);
        if (1 < g_opts_0) {
          nifti_image_write_hdr_img2_cold_1();
        }
        iVar5 = nim->nifti_type;
        if (iVar5 == 3) {
          pzVar6 = nifti_write_ascii_image(nim,local_1b8,local_1b0,write_data,write_opts & 2U);
          return pzVar6;
        }
        local_1c8 = &nim->fname;
        nifti_convert_nim2nhdr(&local_18c,nim);
        if (iVar5 != 1) {
          pcVar7 = nim->iname;
          if ((pcVar7 != (char *)0x0) && (iVar5 = strcmp(pcVar7,*local_1c8), iVar5 == 0)) {
            free(pcVar7);
            nim->iname = (char *)0x0;
          }
          if (nim->iname == (char *)0x0) {
            pcVar7 = nifti_makeimgname(nim->fname,nim->nifti_type,0,0);
            nim->iname = pcVar7;
            if (pcVar7 == (char *)0x0) {
              return (znzFile)0x0;
            }
          }
        }
        pcVar7 = local_1b0;
        ppcVar4 = local_1c8;
        if ((local_1c0 == (znzFile)0x0) || (nim->nifti_type != 1)) {
          if (2 < g_opts_0) {
            fprintf(_stderr,"+d opening output file %s [%s]\n",*local_1c8,local_1b0);
          }
          pcVar2 = *ppcVar4;
          iVar5 = nifti_is_gzfile(pcVar2);
          local_1d0 = znzopen(pcVar2,pcVar7,iVar5);
          if (local_1d0 == (znzFile)0x0) {
            fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1a8,"cannot open output file",
                    *local_1c8);
            return local_1d0;
          }
        }
        else {
          if (2 < g_opts_0) {
            nifti_image_write_hdr_img2_cold_2();
          }
          local_1d0 = local_1c0;
        }
        sVar11 = znzwrite(&local_18c,1,0x15c,local_1d0);
        if (sVar11 < 0x15c) {
          fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1a8,"bad header write to output file",
                  *local_1c8);
        }
        else {
          if (nim->nifti_type != 0) {
            nifti_write_extensions(local_1d0,nim);
          }
          if ((write_opts & 3U) != 0) {
            if (nim->nifti_type != 1) {
              Xznzclose(&local_1d0);
              if (local_1c0 == (znzFile)0x0) {
                if (2 < g_opts_0) {
                  nifti_image_write_hdr_img2_cold_4();
                }
                pcVar2 = nim->iname;
                iVar5 = nifti_is_gzfile(pcVar2);
                local_1d0 = znzopen(pcVar2,pcVar7,iVar5);
                if (local_1d0 == (znzFile)0x0) {
                  pcVar7 = "cannot open image file";
                  local_1d0 = (znzFile)0x0;
                  goto LAB_0011167e;
                }
              }
              else {
                if (2 < g_opts_0) {
                  nifti_image_write_hdr_img2_cold_3();
                }
                local_1d0 = local_1c0;
              }
            }
            znzseek(local_1d0,(long)nim->iname_offset,0);
            if (write_data != 0) {
              nifti_write_all_data(local_1d0,nim,local_1b8);
            }
            if ((write_opts & 2U) != 0) {
              return local_1d0;
            }
            Xznzclose(&local_1d0);
            return local_1d0;
          }
          if (2 < g_opts_0) {
            nifti_image_write_hdr_img2_cold_5();
          }
        }
        Xznzclose(&local_1d0);
        return local_1d0;
      }
      pcVar7 = "no image data";
    }
  }
LAB_0011167e:
  fprintf(_stderr,"** ERROR: nifti_image_write_hdr_img: %s\n",pcVar7);
  return local_1d0;
}

Assistant:

znzFile nifti_image_write_hdr_img2(nifti_image *nim, int write_opts,
               const char * opts, znzFile imgfile, const nifti_brick_list * NBL)
{
   struct nifti_1_header nhdr ;
   znzFile               fp=NULL;
   size_t                ss ;
   int                   write_data, leave_open;
   char                  func[] = { "nifti_image_write_hdr_img2" };

   write_data = write_opts & 1;  /* just separate the bits now */
   leave_open = write_opts & 2;

   if( ! nim                              ) ERREX("NULL input") ;
   if( ! nifti_validfilename(nim->fname)  ) ERREX("bad fname input") ;
   if( write_data && ! nim->data && ! NBL ) ERREX("no image data") ;

   if( write_data && NBL && ! nifti_NBL_matches_nim(nim, NBL) )
      ERREX("NBL does not match nim");

   nifti_set_iname_offset(nim);

   if( g_opts.debug > 1 ){
      fprintf(stderr,"-d writing nifti file '%s'...\n", nim->fname);
      if( g_opts.debug > 2 )
         fprintf(stderr,"-d nifti type %d, offset %d\n",
                 nim->nifti_type, nim->iname_offset);
   }

   if( nim->nifti_type == NIFTI_FTYPE_ASCII )   /* non-standard case */
      return nifti_write_ascii_image(nim,NBL,opts,write_data,leave_open);

   nhdr = nifti_convert_nim2nhdr(nim);    /* create the nifti1_header struct */

   /* if writing to 2 files, make sure iname is set and different from fname */
   if( nim->nifti_type != NIFTI_FTYPE_NIFTI1_1 ){
       if( nim->iname && strcmp(nim->iname,nim->fname) == 0 ){
         free(nim->iname) ; nim->iname = NULL ;
       }
       if( nim->iname == NULL ){ /* then make a new one */
         nim->iname = nifti_makeimgname(nim->fname,nim->nifti_type,0,0);
         if( nim->iname == NULL ) return NULL;
       }
   }

   /* if we have an imgfile and will write the header there, use it */
   if( ! znz_isnull(imgfile) && nim->nifti_type == NIFTI_FTYPE_NIFTI1_1 ){
      if( g_opts.debug > 2 ) fprintf(stderr,"+d using passed file for hdr\n");
      fp = imgfile;
   }
   else {
      if( g_opts.debug > 2 )
         fprintf(stderr,"+d opening output file %s [%s]\n",nim->fname,opts);
      fp = znzopen( nim->fname , opts , nifti_is_gzfile(nim->fname) ) ;
      if( znz_isnull(fp) ){
         LNI_FERR(func,"cannot open output file",nim->fname);
         return fp;
      }
   }

   /* write the header and extensions */

   ss = znzwrite(&nhdr , 1 , sizeof(nhdr) , fp); /* write header */
   if( ss < sizeof(nhdr) ){
      LNI_FERR(func,"bad header write to output file",nim->fname);
      znzclose(fp); return fp;
   }

   /* partial file exists, and errors have been printed, so ignore return */
   if( nim->nifti_type != NIFTI_FTYPE_ANALYZE )
      (void)nifti_write_extensions(fp,nim);

   /* if the header is all we want, we are done */
   if( ! write_data && ! leave_open ){
      if( g_opts.debug > 2 ) fprintf(stderr,"-d header is all we want: done\n");
      znzclose(fp); return(fp);
   }

   if( nim->nifti_type != NIFTI_FTYPE_NIFTI1_1 ){ /* get a new file pointer */
      znzclose(fp);         /* first, close header file */
      if( ! znz_isnull(imgfile) ){
         if(g_opts.debug > 2) fprintf(stderr,"+d using passed file for img\n");
         fp = imgfile;
      }
      else {
         if( g_opts.debug > 2 )
            fprintf(stderr,"+d opening img file '%s'\n", nim->iname);
         fp = znzopen( nim->iname , opts , nifti_is_gzfile(nim->iname) ) ;
         if( znz_isnull(fp) ) ERREX("cannot open image file") ;
      }
   }

   znzseek(fp, nim->iname_offset, SEEK_SET);  /* in any case, seek to offset */

   if( write_data ) nifti_write_all_data(fp,nim,NBL);
   if( ! leave_open ) znzclose(fp);

   return fp;
}